

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O0

REF_STATUS ref_collapse_to_remove_node1(REF_GRID ref_grid,REF_INT *actual_node0,REF_INT node1)

{
  uint uVar1;
  REF_STATUS RVar2;
  bool local_3f65;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL audit;
  REF_DBL min_add;
  REF_DBL min_del;
  REF_BOOL allowed_cavity_ratio;
  REF_BOOL valid_cavity;
  REF_CAVITY ref_cavity;
  REF_BOOL have_geometry_support;
  REF_BOOL local;
  REF_BOOL allowed;
  REF_INT node0;
  REF_DBL ratio_to_collapse [1000];
  REF_INT order [1000];
  REF_INT node_to_collapse [1000];
  int local_40;
  int local_3c;
  REF_INT node;
  REF_INT nnode;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT *pRStack_20;
  REF_INT node1_local;
  REF_INT *actual_node0_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  _allowed_cavity_ratio = (REF_CAVITY)0x0;
  *actual_node0 = -1;
  ref_node._4_4_ = node1;
  pRStack_20 = actual_node0;
  actual_node0_local = (REF_INT *)ref_grid;
  if (((node1 < 0) || (((REF_NODE)ref_cell)->max <= node1)) ||
     (((REF_NODE)ref_cell)->global[node1] < 0)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",0xb4
           ,"ref_collapse_to_remove_node1","node1 is invalid");
    ref_grid_local._4_4_ = 1;
  }
  else {
    if ((ref_grid->surf == 0) && (ref_grid->twod == 0)) {
      _node = ref_grid->cell[8];
    }
    else {
      _node = ref_grid->cell[3];
    }
    uVar1 = ref_cell_node_list_around(_node,node1,1000,&local_3c,order + 0x3e6);
    if (uVar1 == 0) {
      for (local_40 = 0; local_40 < local_3c; local_40 = local_40 + 1) {
        uVar1 = ref_node_ratio((REF_NODE)ref_cell,order[(long)local_40 + 0x3e6],ref_node._4_4_,
                               (REF_DBL *)(&allowed + (long)local_40 * 2));
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0xc2,"ref_collapse_to_remove_node1",(ulong)uVar1,"ratio");
          return uVar1;
        }
      }
      uVar1 = ref_sort_heap_dbl(local_3c,(REF_DBL *)&allowed,(REF_INT *)(ratio_to_collapse + 999));
      if (uVar1 == 0) {
        for (local_40 = 0; local_40 < local_3c; local_40 = local_40 + 1) {
          local = order[(long)order[(long)local_40 + -2] + 0x3e6];
          uVar1 = ref_collapse_edge_mixed
                            ((REF_GRID)actual_node0_local,local,ref_node._4_4_,
                             &have_geometry_support);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0xd3,"ref_collapse_to_remove_node1",(ulong)uVar1,"col mixed");
            return uVar1;
          }
          if (have_geometry_support != 0) {
            uVar1 = ref_collapse_edge_geometry
                              ((REF_GRID)actual_node0_local,local,ref_node._4_4_,
                               &have_geometry_support);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                     ,0xd8,"ref_collapse_to_remove_node1",(ulong)uVar1,"col geom");
              return uVar1;
            }
            if (have_geometry_support != 0) {
              uVar1 = ref_collapse_edge_manifold
                                ((REF_GRID)actual_node0_local,local,ref_node._4_4_,
                                 &have_geometry_support);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                       ,0xdd,"ref_collapse_to_remove_node1",(ulong)uVar1,"col manifold");
                return uVar1;
              }
              if (have_geometry_support != 0) {
                uVar1 = ref_collapse_edge_chord_height
                                  ((REF_GRID)actual_node0_local,local,ref_node._4_4_,
                                   &have_geometry_support);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                         ,0xe2,"ref_collapse_to_remove_node1",(ulong)uVar1,"col edge chord height");
                  return uVar1;
                }
                if (have_geometry_support != 0) {
                  uVar1 = ref_collapse_edge_ratio
                                    ((REF_GRID)actual_node0_local,local,ref_node._4_4_,
                                     &have_geometry_support);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                           ,0xe6,"ref_collapse_to_remove_node1",(ulong)uVar1,"ratio");
                    return uVar1;
                  }
                  if (have_geometry_support != 0) {
                    uVar1 = ref_geom_supported(*(REF_GEOM *)(actual_node0_local + 0x26),local,
                                               (REF_BOOL *)&ref_cavity);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                             ,0xec,"ref_collapse_to_remove_node1",(ulong)uVar1,"geom");
                      return uVar1;
                    }
                    uVar1 = ref_collapse_edge_normdev
                                      ((REF_GRID)actual_node0_local,local,ref_node._4_4_,
                                       &have_geometry_support);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                             ,0xed,"ref_collapse_to_remove_node1",(ulong)uVar1,"normdev");
                      return uVar1;
                    }
                    if (have_geometry_support != 0) {
                      uVar1 = ref_collapse_edge_same_normal
                                        ((REF_GRID)actual_node0_local,local,ref_node._4_4_,
                                         &have_geometry_support);
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                               ,0xf1,"ref_collapse_to_remove_node1",(ulong)uVar1,"normal deviation")
                        ;
                        return uVar1;
                      }
                      if (have_geometry_support != 0) {
                        if ((int)ref_cavity == 0) {
                          uVar1 = ref_collapse_edge_same_tangent
                                            ((REF_GRID)actual_node0_local,local,ref_node._4_4_,
                                             &have_geometry_support);
                          if (uVar1 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                   ,0xf6,"ref_collapse_to_remove_node1",(ulong)uVar1,
                                   "normal deviation");
                            return uVar1;
                          }
                          if (have_geometry_support == 0) goto LAB_001c6945;
                        }
                        if (((int)ref_cavity == 0) && (actual_node0_local[0x42] != 0)) {
                          uVar1 = ref_collapse_edge_twod_orientation
                                            ((REF_GRID)actual_node0_local,local,ref_node._4_4_,
                                             &have_geometry_support);
                          if (uVar1 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                   ,0xfc,"ref_collapse_to_remove_node1",(ulong)uVar1,"norm");
                            return uVar1;
                          }
                          if (have_geometry_support == 0) goto LAB_001c6945;
                        }
                        uVar1 = ref_collapse_edge_tri_quality
                                          ((REF_GRID)actual_node0_local,local,ref_node._4_4_,
                                           &have_geometry_support);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                 ,0x102,"ref_collapse_to_remove_node1",(ulong)uVar1,"tri qual");
                          return uVar1;
                        }
                        if (have_geometry_support != 0) {
                          uVar1 = ref_collapse_edge_tet_quality
                                            ((REF_GRID)actual_node0_local,local,ref_node._4_4_,
                                             &have_geometry_support);
                          if (uVar1 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                   ,0x107,"ref_collapse_to_remove_node1",(ulong)uVar1,"tet qual");
                            return uVar1;
                          }
                          uVar1 = ref_collapse_edge_local_cell
                                            ((REF_GRID)actual_node0_local,local,ref_node._4_4_,
                                             (REF_BOOL *)((long)&ref_cavity + 4));
                          if (uVar1 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                   ,0x10a,"ref_collapse_to_remove_node1",(ulong)uVar1,"colloc");
                            return uVar1;
                          }
                          if (ref_cavity._4_4_ == 0) {
                            if (have_geometry_support != 0) {
                              *(int *)(*(long *)&ref_cell->blank + (long)local * 4) =
                                   *(int *)(*(long *)&ref_cell->blank + (long)local * 4) + 1;
                              *(int *)(*(long *)&ref_cell->blank + (long)(int)ref_node._4_4_ * 4) =
                                   *(int *)(*(long *)&ref_cell->blank +
                                           (long)(int)ref_node._4_4_ * 4) + 1;
                            }
                          }
                          else {
                            if (have_geometry_support != 0) {
                              *pRStack_20 = local;
                              uVar1 = ref_collapse_edge((REF_GRID)actual_node0_local,local,
                                                        ref_node._4_4_);
                              if (uVar1 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                       ,0x138,"ref_collapse_to_remove_node1",(ulong)uVar1,"col!");
                                return uVar1;
                              }
                              if ((*(int *)(*(long *)(actual_node0_local + 0x2a) + 0x84) != 0) &&
                                 (uVar1 = ref_validation_cell_face_node
                                                    ((REF_GRID)actual_node0_local,local), uVar1 != 0
                                 )) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                       ,0x13b,"ref_collapse_to_remove_node1",(ulong)uVar1,
                                       "standard topo");
                                printf("node0 %d node1 %d\n",(ulong)(uint)local,
                                       (ulong)ref_node._4_4_);
                                return uVar1;
                              }
                              return 0;
                            }
                            uVar1 = ref_cavity_create((REF_CAVITY *)&allowed_cavity_ratio);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                     ,0x114,"ref_collapse_to_remove_node1",(ulong)uVar1,"cav create"
                                    );
                              return uVar1;
                            }
                            RVar2 = ref_cavity_form_edge_collapse
                                              (_allowed_cavity_ratio,(REF_GRID)actual_node0_local,
                                               local,ref_node._4_4_);
                            if ((RVar2 == 0) &&
                               (_allowed_cavity_ratio->state != REF_CAVITY_INCONSISTENT)) {
                              uVar1 = ref_cavity_enlarge_visible(_allowed_cavity_ratio);
                              if (uVar1 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                       ,0x118,"ref_collapse_to_remove_node1",(ulong)uVar1,"enlarge")
                                ;
                                return uVar1;
                              }
                              if (_allowed_cavity_ratio->state == REF_CAVITY_VISIBLE) {
                                uVar1 = ref_cavity_ratio(_allowed_cavity_ratio,(REF_BOOL *)&min_del)
                                ;
                                if (uVar1 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                         ,0x11b,"ref_collapse_to_remove_node1",(ulong)uVar1,
                                         "cavity ratio");
                                  return uVar1;
                                }
                                uVar1 = ref_cavity_change(_allowed_cavity_ratio,&min_add,
                                                          (REF_DBL *)&ref_private_macro_code_rss);
                                if (uVar1 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                         ,0x11d,"ref_collapse_to_remove_node1",(ulong)uVar1,
                                         "cavity change");
                                  return uVar1;
                                }
                                local_3f65 = false;
                                if (min_del._0_4_ != 0) {
                                  local_3f65 = *(double *)
                                                (*(long *)(actual_node0_local + 0x2a) + 0x28) <=
                                               _ref_private_macro_code_rss &&
                                               _ref_private_macro_code_rss !=
                                               *(double *)
                                                (*(long *)(actual_node0_local + 0x2a) + 0x28);
                                }
                                min_del._4_4_ = (uint)local_3f65;
                                if (min_del._4_4_ != 0) {
                                  *pRStack_20 = local;
                                  uVar1 = ref_cavity_replace(_allowed_cavity_ratio);
                                  if (uVar1 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                           ,0x123,"ref_collapse_to_remove_node1",(ulong)uVar1,
                                           "cav replace");
                                    return uVar1;
                                  }
                                  uVar1 = ref_cavity_free(_allowed_cavity_ratio);
                                  if (uVar1 == 0) {
                                    _allowed_cavity_ratio = (REF_CAVITY)0x0;
                                    if ((*(int *)(*(long *)(actual_node0_local + 0x2a) + 0x84) != 0)
                                       && (uVar1 = ref_validation_cell_face_node
                                                             ((REF_GRID)actual_node0_local,local),
                                          uVar1 != 0)) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                             ,0x128,"ref_collapse_to_remove_node1",(ulong)uVar1,
                                             "cavity topo");
                                      return uVar1;
                                    }
                                    return 0;
                                  }
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                         ,0x124,"ref_collapse_to_remove_node1",(ulong)uVar1,
                                         "cav free");
                                  return uVar1;
                                }
                                min_del._4_4_ = 0;
                              }
                              if (_allowed_cavity_ratio->state == REF_CAVITY_PARTITION_CONSTRAINED)
                              {
                                *(int *)(*(long *)&ref_cell->blank + (long)local * 4) =
                                     *(int *)(*(long *)&ref_cell->blank + (long)local * 4) + 1;
                                *(int *)(*(long *)&ref_cell->blank + (long)(int)ref_node._4_4_ * 4)
                                     = *(int *)(*(long *)&ref_cell->blank +
                                               (long)(int)ref_node._4_4_ * 4) + 1;
                              }
                            }
                            uVar1 = ref_cavity_free(_allowed_cavity_ratio);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                     ,0x131,"ref_collapse_to_remove_node1",(ulong)uVar1,"cav free");
                              return uVar1;
                            }
                            _allowed_cavity_ratio = (REF_CAVITY)0x0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
LAB_001c6945:
        }
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0xc5,"ref_collapse_to_remove_node1",(ulong)uVar1,"sort lengths");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0xbe,"ref_collapse_to_remove_node1",(ulong)uVar1,"da hood");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_to_remove_node1(REF_GRID ref_grid,
                                                REF_INT *actual_node0,
                                                REF_INT node1) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT nnode, node;
  REF_INT node_to_collapse[MAX_NODE_LIST];
  REF_INT order[MAX_NODE_LIST];
  REF_DBL ratio_to_collapse[MAX_NODE_LIST];
  REF_INT node0;
  REF_BOOL allowed, local, have_geometry_support;
  REF_CAVITY ref_cavity = (REF_CAVITY)NULL;
  REF_BOOL valid_cavity;
  REF_BOOL allowed_cavity_ratio;
  REF_DBL min_del, min_add;
  REF_BOOL audit = REF_FALSE;

  *actual_node0 = REF_EMPTY;
  RAS(ref_node_valid(ref_node, node1), "node1 is invalid");

  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  RSS(ref_cell_node_list_around(ref_cell, node1, MAX_NODE_LIST, &nnode,
                                node_to_collapse),
      "da hood");
  for (node = 0; node < nnode; node++) {
    RSS(ref_node_ratio(ref_node, node_to_collapse[node], node1,
                       &(ratio_to_collapse[node])),
        "ratio");
  }

  RSS(ref_sort_heap_dbl(nnode, ratio_to_collapse, order), "sort lengths");

  /* audit = (nnode > 0 && ratio_to_collapse[order[0]] < 0.2); */
  if (audit) {
    printf("node1 %d %f %f %f\n", node1, ref_node_xyz(ref_node, 0, node1),
           ref_node_xyz(ref_node, 1, node1), ref_node_xyz(ref_node, 2, node1));
  }

  for (node = 0; node < nnode; node++) {
    node0 = node_to_collapse[order[node]];
    if (audit)
      printf(" %d node0 %d ratio %f\n", nnode - node, node0,
             ratio_to_collapse[order[node]]);

    RSS(ref_collapse_edge_mixed(ref_grid, node0, node1, &allowed), "col mixed");
    if (!allowed && audit) printf("   mixed\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    if (!allowed && audit) printf("   geom\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_manifold(ref_grid, node0, node1, &allowed),
        "col manifold");
    if (!allowed && audit) printf("   manifold\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_chord_height(ref_grid, node0, node1, &allowed),
        "col edge chord height");
    if (!allowed && audit) printf("   chord\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_ratio(ref_grid, node0, node1, &allowed), "ratio");
    if (!allowed && audit) printf("   ratio\n");
    if (!allowed) continue;

    RSS(ref_geom_supported(ref_grid_geom(ref_grid), node0,
                           &have_geometry_support),
        "geom");
    RSS(ref_collapse_edge_normdev(ref_grid, node0, node1, &allowed), "normdev");
    if (!allowed && audit) printf("   normdev\n");
    if (!allowed) continue;
    RSS(ref_collapse_edge_same_normal(ref_grid, node0, node1, &allowed),
        "normal deviation");
    if (!allowed && audit) printf("   same normal\n");
    if (!allowed) continue;
    if (!have_geometry_support) {
      RSS(ref_collapse_edge_same_tangent(ref_grid, node0, node1, &allowed),
          "normal deviation");
      if (!allowed && audit) printf("   same tangent\n");
      if (!allowed) continue;
    }
    if (!have_geometry_support && ref_grid_twod(ref_grid)) {
      RSS(ref_collapse_edge_twod_orientation(ref_grid, node0, node1, &allowed),
          "norm");
      if (!allowed && audit) printf("   twod orientation\n");
      if (!allowed) continue;
    }

    RSS(ref_collapse_edge_tri_quality(ref_grid, node0, node1, &allowed),
        "tri qual");
    if (!allowed && audit) printf("   tri qual\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_tet_quality(ref_grid, node0, node1, &allowed),
        "tet qual");
    if (!allowed && audit) printf("   tet qual\n");

    RSS(ref_collapse_edge_local_cell(ref_grid, node0, node1, &local), "colloc");
    if (!local) {
      if (allowed) {
        ref_node_age(ref_node, node0)++;
        ref_node_age(ref_node, node1)++;
      }
      continue;
    }

    if (!allowed) {
      RSS(ref_cavity_create(&ref_cavity), "cav create");
      if ((REF_SUCCESS ==
           ref_cavity_form_edge_collapse(ref_cavity, ref_grid, node0, node1)) &&
          (REF_CAVITY_INCONSISTENT != ref_cavity_state(ref_cavity))) {
        RSS(ref_cavity_enlarge_visible(ref_cavity), "enlarge");
        if (REF_CAVITY_VISIBLE == ref_cavity_state(ref_cavity)) {
          RSS(ref_cavity_ratio(ref_cavity, &allowed_cavity_ratio),
              "cavity ratio");
          RSS(ref_cavity_change(ref_cavity, &min_del, &min_add),
              "cavity change");
          valid_cavity =
              allowed_cavity_ratio &&
              (min_add > ref_grid_adapt(ref_grid, collapse_quality_absolute));
          if (valid_cavity) {
            *actual_node0 = node0;
            RSS(ref_cavity_replace(ref_cavity), "cav replace");
            RSS(ref_cavity_free(ref_cavity), "cav free");
            ref_cavity = (REF_CAVITY)NULL;
            if (ref_grid_adapt(ref_grid, watch_topo))
              RSS(ref_validation_cell_face_node(ref_grid, node0),
                  "cavity topo");
            return REF_SUCCESS;
          }
        }
        if (REF_CAVITY_PARTITION_CONSTRAINED == ref_cavity_state(ref_cavity)) {
          ref_node_age(ref_node, node0)++;
          ref_node_age(ref_node, node1)++;
        }
      }
      RSS(ref_cavity_free(ref_cavity), "cav free");
      ref_cavity = (REF_CAVITY)NULL;
      if (!allowed && audit) printf("   cav unsuccessful\n");
      continue;
    }

    *actual_node0 = node0;
    RSS(ref_collapse_edge(ref_grid, node0, node1), "col!");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSB(ref_validation_cell_face_node(ref_grid, node0), "standard topo",
          { printf("node0 %d node1 %d\n", node0, node1); });
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}